

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::z_formatter::format(z_formatter *this,log_msg *msg,tm *tm_time,memory_buffer *dest)

{
  ulong uVar1;
  char local_41;
  scoped_pad p;
  
  scoped_pad::scoped_pad(&p,6,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_gmtoff / 0x3c;
  if ((int)uVar1 < 0) {
    local_41 = '-';
    fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
    uVar1 = (ulong)(uint)-(int)uVar1;
  }
  else {
    local_41 = '+';
    fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  }
  fmt_helper::pad2<500ul>((int)((uVar1 & 0xffffffff) / 0x3c),dest);
  local_41 = ':';
  fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_41);
  fmt_helper::pad2<500ul>((int)((uVar1 & 0xffffffff) % 0x3c),dest);
  scoped_pad::~scoped_pad(&p);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 6;
        scoped_pad p(field_size, padinfo_, dest);

#ifdef _WIN32
        int total_minutes = get_cached_offset(msg, tm_time);
#else
        // No need to chache under gcc,
        // it is very fast (already stored in tm.tm_gmtoff)
        (void)(msg);
        int total_minutes = os::utc_minutes_offset(tm_time);
#endif
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }